

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O2

Value * duckdb::GetCumulativeOptimizers(Value *__return_storage_ptr__,ProfilingNode *node)

{
  bool bVar1;
  __node_base *p_Var2;
  double dVar3;
  double local_18;
  
  p_Var2 = &(node->profiling_info).metrics._M_h._M_before_begin;
  local_18 = 0.0;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    bVar1 = MetricsUtils::IsOptimizerMetric((MetricsType)*(size_type *)(p_Var2 + 1));
    if (bVar1) {
      dVar3 = Value::GetValue<double>((Value *)(p_Var2 + 2));
      local_18 = local_18 + dVar3;
    }
  }
  Value::CreateValue<double>(__return_storage_ptr__,local_18);
  return __return_storage_ptr__;
}

Assistant:

Value GetCumulativeOptimizers(ProfilingNode &node) {
	auto &metrics = node.GetProfilingInfo().metrics;
	double count = 0;
	for (auto &metric : metrics) {
		if (MetricsUtils::IsOptimizerMetric(metric.first)) {
			count += metric.second.GetValue<double>();
		}
	}
	return Value::CreateValue(count);
}